

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void retstat(LexState *ls)

{
  byte bVar1;
  int iVar2;
  uint local_38;
  int local_34;
  int first;
  int nret;
  expdesc e;
  FuncState *fs;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  bVar1 = luaY_nvarstack((FuncState *)e._16_8_);
  local_38 = (uint)bVar1;
  iVar2 = block_follow(ls,1);
  if ((iVar2 == 0) && ((ls->t).token != 0x3b)) {
    local_34 = explist(ls,(expdesc *)&first);
    if ((first == 0x12) || (first == 0x13)) {
      luaK_setreturns((FuncState *)e._16_8_,(expdesc *)&first,-1);
      if ((first == 0x12) &&
         ((local_34 == 1 && (*(char *)(*(long *)(e._16_8_ + 0x18) + 0x13) == '\0')))) {
        *(uint *)(*(long *)(*(long *)e._16_8_ + 0x40) + (long)(int)e.k * 4) =
             *(uint *)(*(long *)(*(long *)e._16_8_ + 0x40) + (long)(int)e.k * 4) & 0xffffff80 | 0x45
        ;
      }
      local_34 = -1;
    }
    else if (local_34 == 1) {
      local_38 = luaK_exp2anyreg((FuncState *)e._16_8_,(expdesc *)&first);
    }
    else {
      luaK_exp2nextreg((FuncState *)e._16_8_,(expdesc *)&first);
    }
  }
  else {
    local_34 = 0;
  }
  luaK_ret((FuncState *)e._16_8_,local_38,local_34);
  testnext(ls,0x3b);
  return;
}

Assistant:

static void retstat (LexState *ls) {
  /* stat -> RETURN [explist] [';'] */
  FuncState *fs = ls->fs;
  expdesc e;
  int nret;  /* number of values being returned */
  int first = luaY_nvarstack(fs);  /* first slot to be returned */
  if (block_follow(ls, 1) || ls->t.token == ';')
    nret = 0;  /* return no values */
  else {
    nret = explist(ls, &e);  /* optional return values */
    if (hasmultret(e.k)) {
      luaK_setmultret(fs, &e);
      if (e.k == VCALL && nret == 1 && !fs->bl->insidetbc) {  /* tail call? */
        SET_OPCODE(getinstruction(fs,&e), OP_TAILCALL);
        lua_assert(GETARG_A(getinstruction(fs,&e)) == luaY_nvarstack(fs));
      }
      nret = LUA_MULTRET;  /* return all values */
    }
    else {
      if (nret == 1)  /* only one single value? */
        first = luaK_exp2anyreg(fs, &e);  /* can use original slot */
      else {  /* values must go to the top of the stack */
        luaK_exp2nextreg(fs, &e);
        lua_assert(nret == fs->freereg - first);
      }
    }
  }
  luaK_ret(fs, first, nret);
  testnext(ls, ';');  /* skip optional semicolon */
}